

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperOffset::DoRound(ClipperOffset *this,int j,int k,MathKernel *math)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  reference pvVar5;
  cInt cVar6;
  int *piVar7;
  reference pvVar8;
  cInt cVar9;
  double dVar10;
  IntPoint local_78;
  IntPoint local_68;
  int local_54;
  double dStack_50;
  int i;
  double X2;
  double Y;
  double X;
  int local_30;
  int local_2c;
  double dStack_28;
  int steps;
  double a;
  MathKernel *math_local;
  int k_local;
  int j_local;
  ClipperOffset *this_local;
  
  dVar10 = this->m_sinA;
  a = (double)math;
  math_local._0_4_ = k;
  math_local._4_4_ = j;
  _k_local = this;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)k);
  dVar1 = pvVar5->X;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)math_local._4_4_);
  dVar2 = pvVar5->X;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)(int)math_local);
  dVar3 = pvVar5->Y;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)math_local._4_4_);
  dStack_28 = std::function<double_(double,_double)>::operator()
                        (&math->atan2,dVar10,dVar1 * dVar2 + dVar3 * pvVar5->Y);
  cVar6 = Round(this->m_StepsPerRad * ABS(dStack_28));
  local_30 = (int)cVar6;
  X._4_4_ = 1;
  piVar7 = std::max<int>(&local_30,(int *)((long)&X + 4));
  local_2c = *piVar7;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)(int)math_local);
  Y = pvVar5->X;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)(int)math_local);
  X2 = pvVar5->Y;
  for (local_54 = 0; local_54 < local_2c; local_54 = local_54 + 1) {
    pvVar8 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (&this->m_srcPoly,(long)math_local._4_4_);
    cVar6 = Round(Y * this->m_delta + (double)pvVar8->X);
    pvVar8 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (&this->m_srcPoly,(long)math_local._4_4_);
    cVar9 = Round(X2 * this->m_delta + (double)pvVar8->Y);
    IntPoint::IntPoint(&local_68,cVar6,cVar9);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
              (&this->m_destPoly,&local_68);
    dStack_50 = Y;
    dVar10 = this->m_sin * X2;
    X2 = Y * this->m_sin + X2 * this->m_cos;
    Y = Y * this->m_cos + -dVar10;
  }
  pvVar8 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (&this->m_srcPoly,(long)math_local._4_4_);
  lVar4 = pvVar8->X;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)math_local._4_4_);
  cVar6 = Round(pvVar5->X * this->m_delta + (double)lVar4);
  pvVar8 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (&this->m_srcPoly,(long)math_local._4_4_);
  lVar4 = pvVar8->Y;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)math_local._4_4_);
  cVar9 = Round(pvVar5->Y * this->m_delta + (double)lVar4);
  IntPoint::IntPoint(&local_78,cVar6,cVar9);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
            (&this->m_destPoly,&local_78);
  return;
}

Assistant:

void ClipperOffset::DoRound(int j, int k, const MathKernel& math)
{
  double a = math.atan2(m_sinA,
  m_normals[k].X * m_normals[j].X + m_normals[k].Y * m_normals[j].Y);
  int steps = std::max((int)Round(m_StepsPerRad * std::fabs(a)), 1);

  double X = m_normals[k].X, Y = m_normals[k].Y, X2;
  for (int i = 0; i < steps; ++i)
  {
    m_destPoly.push_back(IntPoint(
        Round(m_srcPoly[j].X + X * m_delta),
        Round(m_srcPoly[j].Y + Y * m_delta)));
    X2 = X;
    X = X * m_cos - m_sin * Y;
    Y = X2 * m_sin + Y * m_cos;
  }
  m_destPoly.push_back(IntPoint(
  Round(m_srcPoly[j].X + m_normals[j].X * m_delta),
  Round(m_srcPoly[j].Y + m_normals[j].Y * m_delta)));
}